

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O2

void __thiscall
Linker::CollectDebugInfo(Linker *this,FastVector<unsigned_char_*,_false,_false> *instAddress)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uchar *puVar7;
  
  if (instAddress == (FastVector<unsigned_char_*,_false,_false> *)0x0) {
    uVar5 = 4;
  }
  else {
    uVar5 = (ulong)(instAddress->count * 8 + 4);
  }
  nullcModuleBytecodeSize =
       (ulong)((this->exRegVmConstants).count << 2) +
       (ulong)((this->exRegVmSourceInfo).count * 0xc) +
       (ulong)(this->exMainModuleName).count +
       (ulong)(this->exImportPaths).count +
       (ulong)(this->exSource).count +
       (ulong)(this->exSymbols).count + (ulong)((this->exModules).count * 0x1c) +
       (ulong)((this->exLocals).count * 0x1c) +
       (ulong)((this->exFunctionExplicitTypes).count << 2) +
       (ulong)((this->exFunctionExplicitTypeArrayOffsets).count << 2) +
       (ulong)((this->exFunctions).count * 0x94) +
       (ulong)((this->exVariables).count << 4) +
       (ulong)((this->exTypeConstants).count * 0xc) + (ulong)((this->exTypeExtra).count * 0xc) +
       (ulong)((this->exTypes).count * 0x50 | 4) + (ulong)((this->exRegVmCode).count << 3) + uVar5 +
       0x40;
  FastVector<unsigned_char,_false,_false>::resize
            (&this->fullLinkerData,(uint)nullcModuleBytecodeSize);
  puVar7 = (this->fullLinkerData).data;
  uVar3 = NULLC::WriteArraySizeAndData<ExternTypeInfo>(puVar7,&this->exTypes);
  puVar7 = puVar7 + uVar3;
  uVar3 = NULLC::WriteArraySizeAndData<ExternMemberInfo>(puVar7,&this->exTypeExtra);
  puVar7 = puVar7 + uVar3;
  uVar3 = NULLC::WriteArraySizeAndData<ExternConstantInfo>(puVar7,&this->exTypeConstants);
  puVar7 = puVar7 + uVar3;
  uVar3 = NULLC::WriteArraySizeAndData<ExternVarInfo>(puVar7,&this->exVariables);
  puVar7 = puVar7 + uVar3;
  uVar3 = NULLC::WriteArraySizeAndData<ExternFuncInfo>(puVar7,&this->exFunctions);
  puVar7 = puVar7 + uVar3;
  uVar3 = NULLC::WriteArraySizeAndData<unsigned_int>
                    (puVar7,&this->exFunctionExplicitTypeArrayOffsets);
  puVar7 = puVar7 + uVar3;
  uVar3 = NULLC::WriteArraySizeAndData<unsigned_int>(puVar7,&this->exFunctionExplicitTypes);
  uVar4 = NULLC::WriteArraySizeAndData<ExternLocalInfo>(puVar7 + uVar3,&this->exLocals);
  puVar7 = puVar7 + uVar3 + uVar4;
  uVar3 = NULLC::WriteArraySizeAndData<ExternModuleInfo>(puVar7,&this->exModules);
  uVar5 = (ulong)uVar3;
  *(uint *)(puVar7 + uVar5) = (this->exSymbols).count;
  memcpy((uint *)((long)(puVar7 + uVar5) + 4),(this->exSymbols).data,(ulong)(this->exSymbols).count)
  ;
  uVar6 = (ulong)((this->exSymbols).count + 4);
  lVar1 = uVar6 + uVar5;
  *(uint *)(puVar7 + uVar6 + uVar5) = (this->exSource).count;
  memcpy((uint *)((long)(puVar7 + uVar6 + uVar5) + 4),(this->exSource).data,
         (ulong)(this->exSource).count);
  uVar5 = (ulong)((this->exSource).count + 4);
  lVar2 = uVar5 + lVar1;
  *(uint *)(puVar7 + uVar5 + lVar1) = (this->exImportPaths).count;
  memcpy((uint *)((long)(puVar7 + uVar5 + lVar1) + 4),(this->exImportPaths).data,
         (ulong)(this->exImportPaths).count);
  uVar5 = (ulong)((this->exImportPaths).count + 4);
  *(uint *)(puVar7 + uVar5 + lVar2) = (this->exMainModuleName).count;
  memcpy((uint *)((long)(puVar7 + uVar5 + lVar2) + 4),(this->exMainModuleName).data,
         (ulong)(this->exMainModuleName).count);
  puVar7 = puVar7 + ((this->exMainModuleName).count + 4) + uVar5 + lVar2;
  uVar3 = NULLC::WriteArraySizeAndData<RegVmCmd>(puVar7,&this->exRegVmCode);
  puVar7 = puVar7 + uVar3;
  uVar3 = NULLC::WriteArraySizeAndData<ExternSourceInfo>(puVar7,&this->exRegVmSourceInfo);
  uVar4 = NULLC::WriteArraySizeAndData<unsigned_int>(puVar7 + uVar3,&this->exRegVmConstants);
  puVar7 = puVar7 + uVar3 + uVar4;
  if (instAddress == (FastVector<unsigned_char_*,_false,_false> *)0x0) {
    puVar7[0] = '\0';
    puVar7[1] = '\0';
    puVar7[2] = '\0';
    puVar7[3] = '\0';
    uVar5 = 4;
  }
  else {
    uVar3 = NULLC::WriteArraySizeAndData<unsigned_char*>(puVar7,instAddress);
    uVar5 = (ulong)uVar3;
  }
  *(uint *)(puVar7 + uVar5) = this->globalVarSize;
  nullcModuleBytecodeLocation = (uintptr_t)(this->fullLinkerData).data;
  nullcModuleBytecodeVersion = nullcModuleBytecodeVersion + 1;
  return;
}

Assistant:

void Linker::CollectDebugInfo(FastVector<unsigned char*> *instAddress)
{
	nullcModuleBytecodeSize = 0;

	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypes);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypeExtra);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypeConstants);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exVariables);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctions);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctionExplicitTypeArrayOffsets);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctionExplicitTypes);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exLocals);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exModules);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exSymbols);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exSource);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exImportPaths);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exMainModuleName);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmCode);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmSourceInfo);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmConstants);

	if(instAddress)
		nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(*instAddress);
	else
		nullcModuleBytecodeSize += sizeof(unsigned);

	nullcModuleBytecodeSize += sizeof(unsigned); // exLinker->globalVarSize

	fullLinkerData.resize((unsigned)nullcModuleBytecodeSize);

	unsigned char *pos = fullLinkerData.data;

	pos += NULLC::WriteArraySizeAndData(pos, exTypes);
	pos += NULLC::WriteArraySizeAndData(pos, exTypeExtra);
	pos += NULLC::WriteArraySizeAndData(pos, exTypeConstants);
	pos += NULLC::WriteArraySizeAndData(pos, exVariables);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctions);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctionExplicitTypeArrayOffsets);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctionExplicitTypes);
	pos += NULLC::WriteArraySizeAndData(pos, exLocals);
	pos += NULLC::WriteArraySizeAndData(pos, exModules);
	pos += NULLC::WriteArraySizeAndData(pos, exSymbols);
	pos += NULLC::WriteArraySizeAndData(pos, exSource);
	pos += NULLC::WriteArraySizeAndData(pos, exImportPaths);
	pos += NULLC::WriteArraySizeAndData(pos, exMainModuleName);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmCode);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmSourceInfo);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmConstants);

	if(instAddress)
	{
		pos += NULLC::WriteArraySizeAndData(pos, *instAddress);
	}
	else
	{
		unsigned zero = 0;
		memcpy(pos, &zero, sizeof(zero));
		pos += sizeof(zero);
	}


	memcpy(pos, &globalVarSize, sizeof(globalVarSize));
	pos += sizeof(globalVarSize);

	nullcModuleBytecodeLocation = uintptr_t(fullLinkerData.data);

	nullcModuleBytecodeVersion += 1;
}